

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockExpectedCall_callWithObjectParameterEqualComparison_Test::testBody
          (TEST_MockExpectedCall_callWithObjectParameterEqualComparison_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  uint uVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString SStack_c8;
  TypeForTestingExpectedFunctionCall equalType;
  TypeForTestingExpectedFunctionCall type;
  SimpleString local_98;
  MockNamedValueComparatorsAndCopiersRepository repository;
  TypeForTestingExpectedFunctionCallComparator comparator;
  MockNamedValue parameter;
  
  comparator.super_MockNamedValueComparator._vptr_MockNamedValueComparator =
       (MockNamedValueComparator)&PTR__MockNamedValueComparator_002b64c8;
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            (&repository);
  MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);
  SimpleString::SimpleString((SimpleString *)&parameter,"type");
  MockNamedValueComparatorsAndCopiersRepository::installComparator
            (&repository,(SimpleString *)&parameter,&comparator.super_MockNamedValueComparator);
  SimpleString::~SimpleString((SimpleString *)&parameter);
  type._vptr_TypeForTestingExpectedFunctionCall =
       (_func_int **)&PTR__TypeForTestingExpectedFunctionCall_002b85a0;
  type.value = (int *)operator_new(4,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                                   ,0x26);
  *type.value = 1;
  equalType._vptr_TypeForTestingExpectedFunctionCall =
       (_func_int **)&PTR__TypeForTestingExpectedFunctionCall_002b85a0;
  equalType.value =
       (int *)operator_new(4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                           ,0x26);
  *equalType.value = 1;
  SimpleString::SimpleString(&SStack_c8,"name");
  MockNamedValue::MockNamedValue(&parameter,&SStack_c8);
  SimpleString::~SimpleString(&SStack_c8);
  SimpleString::SimpleString(&SStack_c8,"type");
  MockNamedValue::setConstObjectPointer(&parameter,&SStack_c8,&equalType);
  SimpleString::~SimpleString(&SStack_c8);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&SStack_c8,"type");
  SimpleString::SimpleString(&local_98,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[5])(pMVar1,&SStack_c8,&local_98,&type);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&SStack_c8);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  uVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2b])(pMVar1,&parameter);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(uVar2 & 0xff),"CHECK","call->hasInputParameter(parameter)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x182,pTVar4);
  MockNamedValue::~MockNamedValue(&parameter);
  equalType._vptr_TypeForTestingExpectedFunctionCall =
       (_func_int **)&PTR__TypeForTestingExpectedFunctionCall_002b85a0;
  operator_delete(equalType.value,4);
  type._vptr_TypeForTestingExpectedFunctionCall =
       (_func_int **)&PTR__TypeForTestingExpectedFunctionCall_002b85a0;
  operator_delete(type.value,4);
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            (&repository);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithObjectParameterEqualComparison)
{
    TypeForTestingExpectedFunctionCallComparator comparator;
    MockNamedValueComparatorsAndCopiersRepository repository;
    MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);
    repository.installComparator("type", comparator);

    TypeForTestingExpectedFunctionCall type(1), equalType(1);
    MockNamedValue parameter("name");
    parameter.setConstObjectPointer("type", &equalType);

    call->withParameterOfType("type", "name", &type);
    CHECK(call->hasInputParameter(parameter));
}